

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duckdb_databases.cpp
# Opt level: O2

void duckdb::DuckDBDatabasesFunction
               (ClientContext *context,TableFunctionInput *data_p,DataChunk *output)

{
  AttachedDatabase *this;
  bool bVar1;
  bool value;
  int iVar2;
  GlobalTableFunctionState *pGVar3;
  _func_int **pp_Var4;
  reference pvVar5;
  long value_00;
  Catalog *pCVar6;
  _func_int **pp_Var7;
  _func_int **__n;
  ulong index;
  Value db_path;
  Value local_e8;
  string local_a8;
  LogicalType local_88;
  string local_70;
  string local_50;
  
  pGVar3 = optional_ptr<duckdb::GlobalTableFunctionState,_true>::operator->(&data_p->global_state);
  __n = pGVar3[4]._vptr_GlobalTableFunctionState;
  pp_Var7 = pGVar3[1]._vptr_GlobalTableFunctionState;
  pp_Var4 = pGVar3[2]._vptr_GlobalTableFunctionState;
  if (__n < (_func_int **)((long)pp_Var4 - (long)pp_Var7 >> 3)) {
    for (index = 0; (__n < (_func_int **)((long)pp_Var4 - (long)pp_Var7 >> 3) && (index < 0x800));
        index = index + 1) {
      pGVar3[4]._vptr_GlobalTableFunctionState = (_func_int **)((long)__n + 1);
      pvVar5 = vector<std::reference_wrapper<duckdb::AttachedDatabase>,_true>::get<true>
                         ((vector<std::reference_wrapper<duckdb::AttachedDatabase>,_true> *)
                          (pGVar3 + 1),(size_type)__n);
      this = pvVar5->_M_data;
      ::std::__cxx11::string::string((string *)&local_a8,(string *)&(this->super_CatalogEntry).name)
      ;
      Value::Value(&db_path,&local_a8);
      DataChunk::SetValue(output,0,index,&db_path);
      Value::~Value(&db_path);
      ::std::__cxx11::string::~string((string *)&local_a8);
      value_00 = NumericCastImpl<long,_unsigned_long,_false>::Convert
                           ((this->super_CatalogEntry).oid);
      Value::BIGINT(&db_path,value_00);
      DataChunk::SetValue(output,1,index,&db_path);
      Value::~Value(&db_path);
      bVar1 = AttachedDatabase::IsSystem(this);
      value = true;
      if (!bVar1) {
        value = AttachedDatabase::IsTemporary(this);
      }
      bVar1 = AttachedDatabase::IsReadOnly(this);
      LogicalType::LogicalType(&local_88,SQLNULL);
      Value::Value(&db_path,&local_88);
      LogicalType::~LogicalType(&local_88);
      if (value == false) {
        pCVar6 = AttachedDatabase::GetCatalog(this);
        iVar2 = (*pCVar6->_vptr_Catalog[0x15])(pCVar6);
        if ((char)iVar2 == '\0') {
          pCVar6 = AttachedDatabase::GetCatalog(this);
          (*pCVar6->_vptr_Catalog[0x16])(&local_50,pCVar6);
          Value::Value(&local_e8,&local_50);
          Value::operator=(&db_path,&local_e8);
          Value::~Value(&local_e8);
          ::std::__cxx11::string::~string((string *)&local_50);
        }
      }
      DataChunk::SetValue(output,2,index,&db_path);
      Value::Value(&local_e8,&(this->super_CatalogEntry).comment);
      DataChunk::SetValue(output,3,index,&local_e8);
      Value::~Value(&local_e8);
      Value::MAP(&local_e8,&(this->super_CatalogEntry).tags);
      DataChunk::SetValue(output,4,index,&local_e8);
      Value::~Value(&local_e8);
      Value::BOOLEAN(&local_e8,value);
      DataChunk::SetValue(output,5,index,&local_e8);
      Value::~Value(&local_e8);
      pCVar6 = AttachedDatabase::GetCatalog(this);
      (*pCVar6->_vptr_Catalog[6])(&local_70,pCVar6);
      Value::Value(&local_e8,&local_70);
      DataChunk::SetValue(output,6,index,&local_e8);
      Value::~Value(&local_e8);
      ::std::__cxx11::string::~string((string *)&local_70);
      Value::BOOLEAN(&local_e8,bVar1);
      DataChunk::SetValue(output,7,index,&local_e8);
      Value::~Value(&local_e8);
      Value::~Value(&db_path);
      __n = pGVar3[4]._vptr_GlobalTableFunctionState;
      pp_Var7 = pGVar3[1]._vptr_GlobalTableFunctionState;
      pp_Var4 = pGVar3[2]._vptr_GlobalTableFunctionState;
    }
    output->count = index;
  }
  return;
}

Assistant:

void DuckDBDatabasesFunction(ClientContext &context, TableFunctionInput &data_p, DataChunk &output) {
	auto &data = data_p.global_state->Cast<DuckDBDatabasesData>();
	if (data.offset >= data.entries.size()) {
		// finished returning values
		return;
	}
	// start returning values
	// either fill up the chunk or return all the remaining columns
	idx_t count = 0;
	while (data.offset < data.entries.size() && count < STANDARD_VECTOR_SIZE) {
		auto &entry = data.entries[data.offset++];

		auto &attached = entry.get().Cast<AttachedDatabase>();
		// return values:

		idx_t col = 0;
		// database_name, VARCHAR
		output.SetValue(col++, count, attached.GetName());
		// database_oid, BIGINT
		output.SetValue(col++, count, Value::BIGINT(NumericCast<int64_t>(attached.oid)));
		bool is_internal = attached.IsSystem() || attached.IsTemporary();
		bool is_readonly = attached.IsReadOnly();
		// path, VARCHAR
		Value db_path;
		if (!is_internal) {
			bool in_memory = attached.GetCatalog().InMemory();
			if (!in_memory) {
				db_path = Value(attached.GetCatalog().GetDBPath());
			}
		}
		output.SetValue(col++, count, db_path);
		// comment, VARCHAR
		output.SetValue(col++, count, Value(attached.comment));
		// tags, MAP
		output.SetValue(col++, count, Value::MAP(attached.tags));
		// internal, BOOLEAN
		output.SetValue(col++, count, Value::BOOLEAN(is_internal));
		// type, VARCHAR
		output.SetValue(col++, count, Value(attached.GetCatalog().GetCatalogType()));
		// readonly, BOOLEAN
		output.SetValue(col++, count, Value::BOOLEAN(is_readonly));

		count++;
	}
	output.SetCardinality(count);
}